

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O2

void __thiscall
SLogLib::FileLoggerPriv::FileLoggerPriv
          (FileLoggerPriv *this,string *fileName,openmode mode,FileOpenFlag flag)

{
  char cVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1d0 [32];
  stringstream _stream;
  ostream local_1a0 [376];
  
  std::ofstream::ofstream(this);
  std::__cxx11::string::string((string *)&this->mFileName,(string *)fileName);
  this->mHasAutoFlush = false;
  this->mMode = mode;
  this->mFileOpenFlag = flag;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mFileWriteMutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mFileWriteMutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  if (flag == Immediately) {
    std::ofstream::open((char *)this,(_Ios_Openmode)(this->mFileName)._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&_stream);
      poVar2 = std::operator<<(local_1a0,"SLogLib: Unable to open ");
      poVar2 = std::operator<<(poVar2,(string *)&this->mFileName);
      std::operator<<(poVar2," for writing.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

FileLoggerPriv(const std::string& fileName, std::ios_base::openmode mode, FileOpenFlag flag)
		: mFileName(fileName), mHasAutoFlush(false), mMode(mode), mFileOpenFlag(flag)
	{
		if(mFileOpenFlag == FileOpenFlag::Immediately)
		{
			mFileHandle.open(mFileName.c_str(), mMode);
			if(!mFileHandle.is_open())
			{
				std::stringstream _stream;
				_stream << "SLogLib: Unable to open " << mFileName << " for writing.";
				throw std::runtime_error(_stream.str());
			}
		}
	}